

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::ArraySegmentSpliceHelper<double>
               (JavascriptArray *pnewArr,SparseArraySegment<double> *seg,Type *prev,uint32 start,
               uint32 deleteLen,Var *insertArgs,uint32 insertLen,Recycler *recycler)

{
  int iVar1;
  code *pcVar2;
  Type *this;
  bool bVar3;
  uint uVar4;
  uint *puVar5;
  SparseArraySegmentBase **ppSVar6;
  SparseArraySegment<double> *pSVar7;
  SparseArraySegmentBase *ptr;
  SparseArraySegmentBase *pSVar8;
  undefined4 *puVar9;
  uint32 noElementsToMove;
  bool isInlineSegment;
  SparseArraySegmentBase *oldHead;
  uint local_40;
  uint32 newHeadLen;
  uint32 local_38;
  uint local_34;
  uint32 headDeleteLen;
  uint32 relativeStart;
  Var *insertArgs_local;
  uint32 deleteLen_local;
  uint32 start_local;
  Type *prev_local;
  SparseArraySegment<double> *seg_local;
  JavascriptArray *pnewArr_local;
  
  local_34 = start - (seg->super_SparseArraySegmentBase).left;
  newHeadLen = start + deleteLen;
  local_40 = (seg->super_SparseArraySegmentBase).left + (seg->super_SparseArraySegmentBase).length;
  _headDeleteLen = insertArgs;
  insertArgs_local._0_4_ = deleteLen;
  insertArgs_local._4_4_ = start;
  _deleteLen_local = prev;
  prev_local = (Type *)seg;
  seg_local = (SparseArraySegment<double> *)pnewArr;
  puVar5 = min<unsigned_int>(&newHeadLen,&local_40);
  local_38 = *puVar5 - insertArgs_local._4_4_;
  uVar4 = (*(int *)(prev_local + 4) - local_38) + insertLen;
  if (local_38 != 0) {
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&seg_local[1].super_SparseArraySegmentBase.next);
    pSVar8 = *ppSVar6;
    bVar3 = IsInlineSegment(pSVar8,(JavascriptArray *)seg_local);
    InvalidateLastUsedSegment((JavascriptArray *)seg_local);
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&seg_local[1].super_SparseArraySegmentBase.next);
    pSVar7 = SparseArraySegment<double>::From(*ppSVar6);
    ptr = &SparseArraySegment<double>::CopySegment
                     (recycler,pSVar7,0,(SparseArraySegment<double> *)prev_local,
                      insertArgs_local._4_4_,local_38)->super_SparseArraySegmentBase;
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
              (&seg_local[1].super_SparseArraySegmentBase.next,ptr);
    if ((bVar3) &&
       (ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)&seg_local[1].super_SparseArraySegmentBase.next),
       pSVar8 != *ppSVar6)) {
      (**(code **)(*(long *)&seg_local->super_SparseArraySegmentBase + 0x398))(seg_local,pSVar8,0);
    }
  }
  if (uVar4 == 0) {
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)(prev_local + 0x10));
    pSVar7 = SparseArraySegment<double>::From(*ppSVar6);
    Memory::WriteBarrierPtr<Js::SparseArraySegment<double>_>::operator=(_deleteLen_local,pSVar7);
  }
  else {
    if (*(uint *)(prev_local + 8) < uVar4) {
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)(prev_local + 0x10));
      this = prev_local;
      if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
        prev_local = (Type *)SparseArraySegment<double>::GrowByMin
                                       ((SparseArraySegment<double> *)prev_local,recycler,
                                        uVar4 - *(int *)(prev_local + 8));
      }
      else {
        iVar1 = *(int *)(prev_local + 8);
        pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                           ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)(prev_local + 0x10));
        prev_local = (Type *)SparseArraySegment<double>::GrowByMinMax
                                       ((SparseArraySegment<double> *)this,recycler,uVar4 - iVar1,
                                        (((pSVar8->left - (uint32)insertArgs_local) + insertLen) -
                                        *(int *)prev_local) - *(int *)(prev_local + 8));
      }
      ValidateSegment<double>((SparseArraySegment<double> *)prev_local);
    }
    if (local_38 != insertLen) {
      Memory::MoveArray<double,double,Memory::Recycler>
                ((double *)(prev_local + (ulong)insertLen * 8 + (ulong)local_34 * 8 + 0x18),
                 (double *)(prev_local + (ulong)local_38 * 8 + (ulong)local_34 * 8 + 0x18),
                 (ulong)(*(int *)(prev_local + 4) - (local_34 + local_38)));
      if (uVar4 < *(uint *)(prev_local + 4)) {
        SparseArraySegment<double>::Truncate
                  ((SparseArraySegment<double> *)prev_local,*(int *)prev_local + uVar4);
      }
      *(uint *)(prev_local + 4) = uVar4;
      SparseArraySegmentBase::CheckLengthvsSize((SparseArraySegmentBase *)prev_local);
    }
    if (insertLen != 0) {
      bVar3 = VirtualTableInfo<Js::JavascriptNativeIntArray>::HasVirtualTable(seg_local);
      if ((bVar3) ||
         (bVar3 = VirtualTableInfo<Js::JavascriptNativeFloatArray>::HasVirtualTable(seg_local),
         bVar3)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1c47,
                                    "(!VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pnewArr) && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pnewArr))"
                                    ,
                                    "!VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pnewArr) && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pnewArr)"
                                   );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      Memory::CopyArray<double,double,Memory::Recycler>
                ((double *)(prev_local + (ulong)local_34 * 8 + 0x18),(ulong)insertLen,
                 (double *)_headDeleteLen,(ulong)insertLen);
    }
    Memory::WriteBarrierPtr<Js::SparseArraySegment<double>_>::operator=
              (_deleteLen_local,(SparseArraySegment<double> *)prev_local);
  }
  return;
}

Assistant:

void JavascriptArray::ArraySegmentSpliceHelper(
        JavascriptArray *pnewArr, SparseArraySegment<T> *seg, Field(SparseArraySegment<T>*) *prev,
        uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, Recycler *recycler)
    {
        // book keeping variables
        uint32 relativeStart    = start - seg->left;  // This will be different from start when head->left is non zero -
                                                      //(Missing elements at the beginning)

        uint32 headDeleteLen    = min(start + deleteLen , seg->left + seg->length) - start;   // actual number of elements to delete in
                                                                                              // head if deleteLen overflows the length of head

        uint32 newHeadLen       = seg->length - headDeleteLen + insertLen;     // new length of the head after splice

        // Save the deleted elements
        if (headDeleteLen != 0)
        {
            SparseArraySegmentBase *oldHead = pnewArr->head;
            bool isInlineSegment = JavascriptArray::IsInlineSegment(oldHead, pnewArr);
            pnewArr->InvalidateLastUsedSegment();
            pnewArr->head = SparseArraySegment<T>::CopySegment(recycler, SparseArraySegment<T>::From(pnewArr->head), 0, seg, start, headDeleteLen);
            if (isInlineSegment && oldHead != pnewArr->head)
            {
                pnewArr->ClearElements(oldHead, 0);
            }
        }

        if (newHeadLen != 0)
        {
            if (seg->size < newHeadLen)
            {
                if (seg->next)
                {
                    // If we have "next", require that we haven't adjusted next segments left yet.
                    seg = seg->GrowByMinMax(recycler, newHeadLen - seg->size, seg->next->left - deleteLen + insertLen - seg->left - seg->size);
                }
                else
                {
                    seg = seg->GrowByMin(recycler, newHeadLen - seg->size);
                }
#ifdef VALIDATE_ARRAY
                ValidateSegment(seg);
#endif
            }

            // Move the elements if necessary
            if (headDeleteLen != insertLen)
            {
                uint32 noElementsToMove = seg->length - (relativeStart + headDeleteLen);
                MoveArray(seg->elements + relativeStart + insertLen,
                            seg->elements + relativeStart + headDeleteLen,
                            noElementsToMove);
                if (newHeadLen < seg->length) // truncate if necessary
                {
                    seg->Truncate(seg->left + newHeadLen); // set end elements to null so that when we introduce null elements we are safe
                }
                seg->length = newHeadLen;
                seg->CheckLengthvsSize();
            }
            // Copy the new elements
            if (insertLen > 0)
            {
                Assert(!VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pnewArr) &&
                   !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pnewArr));

                // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
                CopyArray(seg->elements + relativeStart, insertLen,
                          reinterpret_cast<const T*>(insertArgs), insertLen);
            }
            *prev = seg;
        }
        else
        {
            *prev = SparseArraySegment<T>::From(seg->next);
        }
    }